

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O1

bool __thiscall
chrono::ChArchiveExplorer::IsObject<std::vector<myEmployee,std::allocator<myEmployee>>>
          (ChArchiveExplorer *this,vector<myEmployee,_std::allocator<myEmployee>_> *root)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"_","");
  PrepareSearch(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  local_40._M_dataplus._M_p = "";
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_string_length = (size_type)root;
  ChArchiveOut::out<myEmployee>
            (&this->super_ChArchiveOut,
             (ChNameValue<std::vector<myEmployee,_std::allocator<myEmployee>_>_> *)&local_40);
  return this->found_obj;
}

Assistant:

bool IsObject(const T& root) {

          this->PrepareSearch("_");
          this->operator<<( CHNVP(root,"") ); // SCAN! 
          if (this->found_obj) 
              return true;
          else 
              return false;
      }